

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ModuleInfo * __thiscall ComponentManager::getModInfo(ComponentManager *this,char *name)

{
  __type _Var1;
  Node *pNVar2;
  ModuleInfo *pMVar3;
  allocator<char> local_71;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  
  std::__cxx11::string::string<std::allocator<char>>(local_70,name,&local_71);
  std::__cxx11::string::string((string *)&local_50,local_70);
  local_30 = 0;
  uStack_28 = 0;
  std::__cxx11::string::~string(local_70);
  pNVar2 = (this->mModules).mHead;
  pMVar3 = (ModuleInfo *)0x0;
  do {
    pNVar2 = pNVar2->next;
    if (pNVar2 == (this->mModules).mTail) goto LAB_001026ca;
    _Var1 = std::operator==(&local_50,&pNVar2->val->mName);
  } while (!_Var1);
  pMVar3 = pNVar2->val;
LAB_001026ca:
  std::__cxx11::string::~string((string *)&local_50);
  return pMVar3;
}

Assistant:

ComponentManager::ModuleInfo *ComponentManager::getModInfo( const char *name )
{
	ModuleInfo match( name );

	for (JetHead::list<ModuleInfo*>::iterator i = mModules.begin(); 
		 i != mModules.end(); ++i)
	{
		if (*(*i) == match)
			return *i;
	}
	
	return NULL;
}